

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex>
          (QMovableArrayOps<QModelIndex> *this,qsizetype i,QModelIndex *args)

{
  undefined8 uVar1;
  bool bVar2;
  qsizetype qVar3;
  QModelIndex *pQVar4;
  undefined8 *in_RDX;
  QModelIndex *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QModelIndex tmp;
  QModelIndex *in_stack_ffffffffffffff68;
  QArrayDataPointer<QModelIndex> *in_stack_ffffffffffffff70;
  Inserter *this_00;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined1 uVar5;
  GrowthPosition in_stack_ffffffffffffff8c;
  QArrayDataPointer<QModelIndex> *in_stack_ffffffffffffff90;
  Inserter local_48;
  undefined8 local_20;
  quintptr local_18;
  QAbstractItemModel *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QArrayDataPointer<QModelIndex>::needsDetach(in_stack_ffffffffffffff70);
  if (!bVar2) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar3 = QArrayDataPointer<QModelIndex>::freeSpaceAtEnd
                          ((QArrayDataPointer<QModelIndex> *)
                           CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78)),
       qVar3 != 0)) {
      pQVar4 = QArrayDataPointer<QModelIndex>::end(in_stack_ffffffffffffff70);
      uVar1 = *in_RDX;
      pQVar4->r = (int)uVar1;
      pQVar4->c = (int)((ulong)uVar1 >> 0x20);
      pQVar4->i = in_RDX[1];
      (pQVar4->m).ptr = (QAbstractItemModel *)in_RDX[2];
      in_RDI->displaceTo = (QModelIndex *)((long)&in_RDI->displaceTo->r + 1);
      goto LAB_0084f143;
    }
    if ((in_RSI == (QModelIndex *)0x0) &&
       (qVar3 = QArrayDataPointer<QModelIndex>::freeSpaceAtBegin
                          ((QArrayDataPointer<QModelIndex> *)
                           CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78)),
       qVar3 != 0)) {
      pQVar4 = QArrayDataPointer<QModelIndex>::begin((QArrayDataPointer<QModelIndex> *)0x84efab);
      uVar1 = *in_RDX;
      pQVar4[-1].r = (int)uVar1;
      pQVar4[-1].c = (int)((ulong)uVar1 >> 0x20);
      pQVar4[-1].i = in_RDX[1];
      pQVar4[-1].m.ptr = (QAbstractItemModel *)in_RDX[2];
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QModelIndex *)((long)&in_RDI->displaceTo->r + 1);
      goto LAB_0084f143;
    }
  }
  local_20 = *in_RDX;
  local_18 = in_RDX[1];
  local_10 = (QAbstractItemModel *)in_RDX[2];
  bVar2 = in_RDI->displaceTo != (QModelIndex *)0x0;
  uVar5 = bVar2 && in_RSI == (QModelIndex *)0x0;
  QArrayDataPointer<QModelIndex>::detachAndGrow
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,(qsizetype)in_RDI,
             (QModelIndex **)CONCAT17(uVar5,in_stack_ffffffffffffff78),in_stack_ffffffffffffff70);
  if (bVar2 && in_RSI == (QModelIndex *)0x0) {
    pQVar4 = QArrayDataPointer<QModelIndex>::begin((QArrayDataPointer<QModelIndex> *)0x84f0a7);
    pQVar4[-1].r = (undefined4)local_20;
    pQVar4[-1].c = local_20._4_4_;
    pQVar4[-1].i = local_18;
    pQVar4[-1].m.ptr = local_10;
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QModelIndex *)((long)&in_RDI->displaceTo->r + 1);
  }
  else {
    this_00 = &local_48;
    Inserter::Inserter(in_RDI,(QArrayDataPointer<QModelIndex> *)
                              CONCAT17(uVar5,in_stack_ffffffffffffff78),(qsizetype)this_00,
                       (qsizetype)in_stack_ffffffffffffff68);
    Inserter::insertOne(this_00,in_stack_ffffffffffffff68);
    Inserter::~Inserter(&local_48);
  }
LAB_0084f143:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }